

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_Name_Test::TestBody
          (DescriptorTest_Name_Test *this)

{
  ushort *puVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper AStack_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  puVar1 = (ushort *)(((this->super_DescriptorTest).message_)->all_names_).payload_;
  local_20._M_len = (size_t)*puVar1;
  local_20._M_str = (char *)((long)puVar1 + ~local_20._M_len);
  testing::internal::CmpHelperEQ<char[12],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"TestMessage\"","message_->name()",(char (*) [12])"TestMessage",&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3ae,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_str = (((this->super_DescriptorTest).message_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[12],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"TestMessage\"","message_->full_name()",(char (*) [12])"TestMessage",
             &local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3af,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_len = (size_t)((this->super_DescriptorTest).message_)->file_;
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            (local_30,"foo_file_","message_->file()",&(this->super_DescriptorTest).foo_file_,
             (FileDescriptor **)&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3b0,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((FileDescriptor *)local_20._M_len != (FileDescriptor *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  puVar1 = (ushort *)(((this->super_DescriptorTest).message2_)->all_names_).payload_;
  local_20._M_len = (size_t)*puVar1;
  local_20._M_str = (char *)((long)puVar1 + ~local_20._M_len);
  testing::internal::CmpHelperEQ<char[13],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"TestMessage2\"","message2_->name()",(char (*) [13])0x107c1f9,&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3b2,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_str = (((this->super_DescriptorTest).message2_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[26],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"corge.grault.TestMessage2\"","message2_->full_name()",
             (char (*) [26])"corge.grault.TestMessage2",&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3b3,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_len = (size_t)((this->super_DescriptorTest).message2_)->file_;
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            (local_30,"bar_file_","message2_->file()",&(this->super_DescriptorTest).bar_file_,
             (FileDescriptor **)&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3b4,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((FileDescriptor *)local_20._M_len != (FileDescriptor *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  return;
}

Assistant:

TEST_F(DescriptorTest, Name) {
  EXPECT_EQ("TestMessage", message_->name());
  EXPECT_EQ("TestMessage", message_->full_name());
  EXPECT_EQ(foo_file_, message_->file());

  EXPECT_EQ("TestMessage2", message2_->name());
  EXPECT_EQ("corge.grault.TestMessage2", message2_->full_name());
  EXPECT_EQ(bar_file_, message2_->file());
}